

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_examples.c
# Opt level: O3

psa_status_t
cipher_decrypt(psa_key_handle_t key_handle,psa_algorithm_t alg,uint8_t *iv,size_t iv_size,
              uint8_t *input,size_t input_size,size_t part_size,uint8_t *output,size_t output_size,
              size_t *output_len)

{
  uint uVar1;
  undefined8 uVar2;
  psa_cipher_operation_t local_98;
  
  local_98.ctx.cipher.iv_size = 0;
  local_98.ctx.cipher.cipher_ctx = (void *)0x0;
  local_98.ctx._56_8_ = 0;
  local_98.ctx._64_8_ = 0;
  local_98.ctx._40_8_ = 0;
  local_98.ctx.cipher.unprocessed_len = 0;
  local_98.ctx.cipher.get_padding = (_func_int_uchar_ptr_size_t_size_t_ptr *)0x0;
  local_98.ctx._32_8_ = 0;
  local_98.ctx._8_8_ = 0;
  local_98.ctx.cipher.add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
  local_98.alg = 0;
  local_98._4_1_ = 0;
  local_98.iv_size = '\0';
  local_98.block_size = '\0';
  local_98._7_1_ = 0;
  local_98.ctx.cipher.cipher_info = (mbedtls_cipher_info_t *)0x0;
  local_98.ctx.cipher.cmac_ctx = (mbedtls_cmac_context_t *)0x0;
  uVar1 = psa_cipher_decrypt_setup(&local_98,key_handle,alg);
  if (uVar1 == 0) {
    uVar1 = psa_cipher_set_iv(&local_98,iv,0x10);
    if (uVar1 == 0) {
      uVar1 = cipher_operation(&local_98,(uint8_t *)iv_size,(size_t)input,input_size,
                               (uint8_t *)part_size,(size_t)output,(size_t *)output_size);
      if (uVar1 == 0) {
        uVar1 = 0;
        goto LAB_0010da85;
      }
      uVar2 = 0x84;
    }
    else {
      uVar2 = 0x80;
    }
  }
  else {
    uVar2 = 0x7d;
  }
  printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
         ,uVar2,(ulong)uVar1,0);
LAB_0010da85:
  psa_cipher_abort(&local_98);
  return uVar1;
}

Assistant:

static psa_status_t cipher_decrypt( psa_key_handle_t key_handle,
                                    psa_algorithm_t alg,
                                    const uint8_t * iv,
                                    size_t iv_size,
                                    const uint8_t * input,
                                    size_t input_size,
                                    size_t part_size,
                                    uint8_t * output,
                                    size_t output_size,
                                    size_t *output_len )
{
    psa_status_t status;
    psa_cipher_operation_t operation = PSA_CIPHER_OPERATION_INIT;

    memset( &operation, 0, sizeof( operation ) );
    status = psa_cipher_decrypt_setup( &operation, key_handle, alg );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = psa_cipher_set_iv( &operation, iv, iv_size );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = cipher_operation( &operation, input, input_size, part_size,
                               output, output_size, output_len );
    ASSERT_STATUS( status, PSA_SUCCESS );

exit:
    psa_cipher_abort( &operation );
    return( status );
}